

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O3

void t_generator::parse_options
               (string *options,string *language,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parsed_options)

{
  long lVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  string key;
  string value;
  string option;
  key_type local_b8;
  undefined1 *local_98;
  char *local_90;
  undefined1 local_88 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78 = parsed_options;
  lVar1 = std::__cxx11::string::find((char)options,0x3a);
  std::__cxx11::string::substr((ulong)local_70,(ulong)options);
  std::__cxx11::string::operator=((string *)language,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (((lVar1 != -1) && (lVar1 + 1U != 0xffffffffffffffff)) &&
     (lVar1 + 1U < options->_M_string_length)) {
    do {
      lVar1 = std::__cxx11::string::find((char)options,0x2c);
      std::__cxx11::string::substr((ulong)local_70,(ulong)options);
      uVar3 = lVar1 + 1;
      if (uVar3 == 0) {
        uVar3 = 0xffffffffffffffff;
      }
      lVar1 = std::__cxx11::string::find((char)local_70,0x3d);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98 = local_88;
      local_90 = (char *)0x0;
      local_88[0] = 0;
      if (lVar1 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_b8);
        std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,0x378967);
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
        std::__cxx11::string::operator=((string *)&local_98,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_78,&local_b8);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    } while ((uVar3 != 0xffffffffffffffff) && (uVar3 < options->_M_string_length));
  }
  return;
}

Assistant:

void t_generator::parse_options(const string& options,
                                string& language,
                                map<string, string>& parsed_options) {
  string::size_type colon = options.find(':');
  language = options.substr(0, colon);

  if (colon != string::npos) {
    string::size_type pos = colon + 1;
    while (pos != string::npos && pos < options.size()) {
      string::size_type next_pos = options.find(',', pos);
      string option = options.substr(pos, next_pos - pos);
      pos = ((next_pos == string::npos) ? next_pos : next_pos + 1);

      string::size_type separator = option.find('=');
      string key, value;
      if (separator == string::npos) {
        key = option;
        value = "";
      } else {
        key = option.substr(0, separator);
        value = option.substr(separator + 1);
      }

      parsed_options[key] = value;
    }
  }
}